

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O2

void deqp::gles31::Functional::FboTestUtil::readPixels
               (Context *ctx,Surface *dst,int x,int y,int width,int height,TextureFormat *format,
               Vec4 *scale,Vec4 *bias)

{
  int iVar1;
  TransferFormat TVar2;
  int xo;
  uint rowPitch;
  int y_00;
  TextureFormat readFormat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ConstPixelBufferAccess src;
  undefined1 local_88 [32];
  tcu local_68 [16];
  PixelBufferAccess dstAccess;
  
  readFormat = getFramebufferReadFormat(format);
  TVar2 = glu::getTransferFormat(readFormat);
  iVar1 = tcu::TextureFormat::getPixelSize(&readFormat);
  rowPitch = iVar1 * width + 3U & 0xfffffffc;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,(long)(int)(rowPitch * height),(allocator_type *)&src);
  (*ctx->_vptr_Context[0x78])
            (ctx,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)width,height,(ulong)TVar2 & 0xffffffff,
             (ulong)TVar2 >> 0x20,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&src,&readFormat,width,height,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::Surface::setSize(dst,width,height);
  tcu::Surface::getAccess(&dstAccess,dst);
  iVar1 = 0;
  if (width < 1) {
    width = 0;
  }
  if (height < 1) {
    height = 0;
  }
  for (; iVar1 != height; iVar1 = iVar1 + 1) {
    for (y_00 = 0; width != y_00; y_00 = y_00 + 1) {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_88,(int)&src,y_00,iVar1)
      ;
      tcu::operator*((tcu *)(local_88 + 0x10),(Vector<float,_4> *)local_88,scale);
      tcu::operator+(local_68,(Vector<float,_4> *)(local_88 + 0x10),bias);
      tcu::PixelBufferAccess::setPixel(&dstAccess,(Vec4 *)local_68,y_00,iVar1,0);
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void readPixels (sglr::Context& ctx, tcu::Surface& dst, int x, int y, int width, int height, const tcu::TextureFormat& format, const tcu::Vec4& scale, const tcu::Vec4& bias)
{
	tcu::TextureFormat		readFormat		= getFramebufferReadFormat(format);
	glu::TransferFormat		transferFmt		= glu::getTransferFormat(readFormat);
	int						alignment		= 4; // \note GL_PACK_ALIGNMENT = 4 is assumed.
	int						rowSize			= deAlign32(readFormat.getPixelSize()*width, alignment);
	vector<deUint8>			data			(rowSize*height);

	ctx.readPixels(x, y, width, height, transferFmt.format, transferFmt.dataType, &data[0]);

	// Convert to surface.
	tcu::ConstPixelBufferAccess src(readFormat, width, height, 1, rowSize, 0, &data[0]);

	dst.setSize(width, height);
	tcu::PixelBufferAccess dstAccess = dst.getAccess();

	for (int yo = 0; yo < height; yo++)
	for (int xo = 0; xo < width; xo++)
		dstAccess.setPixel(src.getPixel(xo, yo) * scale + bias, xo, yo);
}